

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_build_certificate_message
              (ptls_buffer_t *buf,ptls_iovec_t context,ptls_iovec_t *certificates,
              size_t num_certificates,ptls_iovec_t ocsp_status)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  bool bVar12;
  
  iVar2 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar2 == 0) {
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    sVar6 = buf->off;
    iVar2 = ptls_buffer__do_pushv(buf,context.base,context.len);
    if (iVar2 == 0) {
      uVar4 = buf->off - sVar6;
      iVar2 = 0;
      if (uVar4 < 0x100) {
        buf->base[sVar6 - 1] = (uint8_t)uVar4;
        bVar12 = true;
        goto LAB_00106bfb;
      }
      iVar2 = 0x20c;
    }
  }
  bVar12 = false;
LAB_00106bfb:
  if (bVar12) {
    iVar2 = ptls_buffer_reserve_aligned(buf,3,'\0');
    if (iVar2 == 0) {
      puVar1 = buf->base;
      sVar6 = buf->off;
      puVar1[sVar6 + 2] = '\0';
      puVar1 = puVar1 + sVar6;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      buf->off = buf->off + 3;
      iVar2 = 0;
    }
    if (iVar2 == 0) {
      sVar6 = buf->off;
      if (num_certificates == 0) {
        iVar2 = 0;
        bVar12 = true;
      }
      else {
        sVar9 = 0;
        do {
          iVar2 = ptls_buffer_reserve_aligned(buf,3,'\0');
          if (iVar2 == 0) {
            puVar1 = buf->base;
            sVar10 = buf->off;
            puVar1[sVar10 + 2] = '\0';
            puVar1 = puVar1 + sVar10;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            buf->off = buf->off + 3;
            iVar2 = 0;
          }
          iVar11 = 6;
          if (iVar2 == 0) {
            sVar10 = buf->off;
            iVar2 = ptls_buffer__do_pushv(buf,certificates[sVar9].base,certificates[sVar9].len);
            if (iVar2 != 0) goto LAB_00106cd4;
            uVar4 = buf->off - sVar10;
            if (0xffffff < uVar4) {
              iVar2 = 0x20c;
              goto LAB_00106cd4;
            }
            lVar5 = 0x10;
            do {
              buf->base[sVar10 - 3] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
              lVar5 = lVar5 + -8;
              sVar10 = sVar10 + 1;
            } while (lVar5 != -8);
            iVar11 = 0;
            bVar12 = true;
            iVar2 = 0;
          }
          else {
LAB_00106cd4:
            bVar12 = false;
          }
          if (!bVar12) goto LAB_00106f6f;
          iVar2 = ptls_buffer_reserve_aligned(buf,2,'\0');
          if (iVar2 == 0) {
            puVar1 = buf->base;
            sVar10 = buf->off;
            (puVar1 + sVar10)[0] = '\0';
            (puVar1 + sVar10)[1] = '\0';
            buf->off = buf->off + 2;
            iVar2 = 0;
          }
          iVar11 = 6;
          if (iVar2 == 0) {
            sVar10 = buf->off;
            iVar3 = 0;
            if (sVar9 == 0 && ocsp_status.len != 0) {
              iVar2 = ptls_buffer_reserve_aligned(buf,2,'\0');
              if (iVar2 == 0) {
                puVar1 = buf->base;
                sVar8 = buf->off;
                (puVar1 + sVar8)[0] = '\0';
                (puVar1 + sVar8)[1] = '\x05';
                buf->off = buf->off + 2;
                iVar2 = 0;
              }
              iVar11 = 6;
              if (iVar2 != 0) goto LAB_00106d0f;
              iVar3 = ptls_buffer_reserve_aligned(buf,2,'\0');
              if (iVar3 == 0) {
                puVar1 = buf->base;
                sVar8 = buf->off;
                (puVar1 + sVar8)[0] = '\0';
                (puVar1 + sVar8)[1] = '\0';
                buf->off = buf->off + 2;
                iVar3 = 0;
              }
              iVar11 = 6;
              if (iVar3 == 0) {
                sVar8 = buf->off;
                iVar3 = ptls_buffer_reserve_aligned(buf,1,'\0');
                if (iVar3 == 0) {
                  buf->base[buf->off] = '\x01';
                  buf->off = buf->off + 1;
                  iVar3 = 0;
                }
                if (iVar3 == 0) {
                  iVar3 = ptls_buffer_reserve_aligned(buf,3,'\0');
                  if (iVar3 == 0) {
                    puVar1 = buf->base;
                    sVar7 = buf->off;
                    puVar1[sVar7 + 2] = '\0';
                    puVar1 = puVar1 + sVar7;
                    puVar1[0] = '\0';
                    puVar1[1] = '\0';
                    buf->off = buf->off + 3;
                    iVar3 = 0;
                  }
                  iVar11 = 6;
                  if (iVar3 == 0) {
                    sVar7 = buf->off;
                    iVar3 = ptls_buffer__do_pushv(buf,ocsp_status.base,ocsp_status.len);
                    if (iVar3 != 0) goto LAB_00106e8e;
                    uVar4 = buf->off - sVar7;
                    if (0xffffff < uVar4) {
                      iVar3 = 0x20c;
                      goto LAB_00106e8e;
                    }
                    lVar5 = 0x10;
                    do {
                      buf->base[sVar7 - 3] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
                      lVar5 = lVar5 + -8;
                      sVar7 = sVar7 + 1;
                    } while (lVar5 != -8);
                    iVar11 = 0;
                    bVar12 = true;
                    iVar3 = 0;
                  }
                  else {
LAB_00106e8e:
                    bVar12 = false;
                  }
                  if (bVar12) {
                    uVar4 = buf->off - sVar8;
                    if (uVar4 < 0x10000) {
                      lVar5 = 8;
                      do {
                        buf->base[sVar8 - 2] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
                        lVar5 = lVar5 + -8;
                        sVar8 = sVar8 + 1;
                      } while (lVar5 != -8);
                      iVar11 = 0;
                    }
                    else {
                      iVar3 = 0x20c;
                      iVar11 = 6;
                    }
                  }
                }
              }
              iVar2 = iVar3;
              if (iVar11 != 0) goto LAB_00106d0f;
            }
            uVar4 = buf->off - sVar10;
            iVar11 = 6;
            iVar2 = 0x20c;
            if (uVar4 < 0x10000) {
              lVar5 = 8;
              do {
                buf->base[sVar10 - 2] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
                lVar5 = lVar5 + -8;
                sVar10 = sVar10 + 1;
              } while (lVar5 != -8);
              iVar11 = 0;
              iVar2 = iVar3;
            }
          }
LAB_00106d0f:
          if (iVar11 != 0) goto LAB_00106f6f;
          sVar9 = sVar9 + 1;
        } while (sVar9 != num_certificates);
        iVar11 = 0;
LAB_00106f6f:
        bVar12 = iVar11 == 0;
      }
      if (bVar12) {
        uVar4 = buf->off - sVar6;
        iVar2 = 0x20c;
        if (uVar4 < 0x1000000) {
          lVar5 = 0x10;
          do {
            buf->base[sVar6 - 3] = (uint8_t)(uVar4 >> ((byte)lVar5 & 0x3f));
            lVar5 = lVar5 + -8;
            sVar6 = sVar6 + 1;
          } while (lVar5 != -8);
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ptls_build_certificate_message(ptls_buffer_t *buf, ptls_iovec_t context, ptls_iovec_t *certificates, size_t num_certificates,
                                   ptls_iovec_t ocsp_status)
{
    int ret;

    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, context.base, context.len); });
    ptls_buffer_push_block(buf, 3, {
        size_t i;
        for (i = 0; i != num_certificates; ++i) {
            ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, certificates[i].base, certificates[i].len); });
            ptls_buffer_push_block(buf, 2, {
                if (i == 0 && ocsp_status.len != 0) {
                    buffer_push_extension(buf, PTLS_EXTENSION_TYPE_STATUS_REQUEST, {
                        ptls_buffer_push(buf, 1); /* status_type == ocsp */
                        ptls_buffer_push_block(buf, 3, { ptls_buffer_pushv(buf, ocsp_status.base, ocsp_status.len); });
                    });
                }
            });
        }
    });

    ret = 0;
Exit:
    return ret;
}